

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distance_calculation.cc
# Opt level: O0

bool __thiscall
sptk::DistanceCalculation::Run
          (DistanceCalculation *this,vector<double,_std::allocator<double>_> *vector1,
          vector<double,_std::allocator<double>_> *vector2,double *distance)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  double *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double dVar6;
  double dVar7;
  double log_diff;
  double diff_3;
  int m_3;
  double diff_2;
  int m_2;
  double diff_1;
  int m_1;
  double diff;
  int m;
  double sum;
  double *y;
  double *x;
  int local_74;
  int local_64;
  int local_54;
  int local_44;
  double local_40;
  bool local_1;
  
  if (((((*(byte *)(in_RDI + 0x10) & 1) == 0) ||
       (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar3 != (long)(*(int *)(in_RDI + 8) + 1))) ||
      (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX),
      sVar3 != (long)(*(int *)(in_RDI + 8) + 1))) || (in_RCX == (double *)0x0)) {
    local_1 = false;
  }
  else {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
    local_40 = 0.0;
    switch(*(undefined4 *)(in_RDI + 0xc)) {
    case 0:
      for (local_44 = 0; local_44 <= *(int *)(in_RDI + 8); local_44 = local_44 + 1) {
        local_40 = ABS(pvVar4[local_44] - pvVar5[local_44]) + local_40;
      }
      break;
    case 1:
      for (local_54 = 0; local_54 <= *(int *)(in_RDI + 8); local_54 = local_54 + 1) {
        local_40 = (pvVar4[local_54] - pvVar5[local_54]) * (pvVar4[local_54] - pvVar5[local_54]) +
                   local_40;
      }
      local_40 = sqrt(local_40);
      break;
    case 2:
      for (local_64 = 0; local_64 <= *(int *)(in_RDI + 8); local_64 = local_64 + 1) {
        local_40 = (pvVar4[local_64] - pvVar5[local_64]) * (pvVar4[local_64] - pvVar5[local_64]) +
                   local_40;
      }
      break;
    case 3:
      for (local_74 = 0; local_74 <= *(int *)(in_RDI + 8); local_74 = local_74 + 1) {
        if ((pvVar4[local_74] <= 0.0) || (pvVar5[local_74] <= 0.0)) {
          return false;
        }
        dVar1 = pvVar4[local_74];
        dVar2 = pvVar5[local_74];
        dVar6 = log(pvVar4[local_74]);
        dVar7 = log(pvVar5[local_74]);
        local_40 = (dVar1 - dVar2) * (dVar6 - dVar7) + local_40;
      }
      break;
    default:
      return false;
    }
    *in_RCX = local_40;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool DistanceCalculation::Run(const std::vector<double>& vector1,
                              const std::vector<double>& vector2,
                              double* distance) const {
  // Check inputs.
  if (!is_valid_ ||
      vector1.size() != static_cast<std::size_t>(num_order_ + 1) ||
      vector2.size() != static_cast<std::size_t>(num_order_ + 1) ||
      NULL == distance) {
    return false;
  }

  const double* x(&(vector1[0]));
  const double* y(&(vector2[0]));

  double sum(0.0);

  switch (distance_metric_) {
    case kManhattan: {
      for (int m(0); m <= num_order_; ++m) {
        const double diff(x[m] - y[m]);
        sum += std::fabs(diff);
      }
      break;
    }
    case kEuclidean: {
      for (int m(0); m <= num_order_; ++m) {
        const double diff(x[m] - y[m]);
        sum += diff * diff;
      }
      sum = std::sqrt(sum);
      break;
    }
    case kSquaredEuclidean: {
      for (int m(0); m <= num_order_; ++m) {
        const double diff(x[m] - y[m]);
        sum += diff * diff;
      }
      break;
    }
    case kSymmetricKullbackLeibler: {
      for (int m(0); m <= num_order_; ++m) {
        if (x[m] <= 0.0 || y[m] <= 0.0) return false;
        const double diff(x[m] - y[m]);
        const double log_diff(std::log(x[m]) - std::log(y[m]));
        sum += diff * log_diff;
      }
      break;
    }
    default: {
      return false;
    }
  }

  *distance = sum;

  return true;
}